

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode parseurl_and_replace(char *url,CURLU *u,uint flags)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  CURLUcode CVar5;
  uint uVar6;
  uint uVar7;
  CURLcode CVar8;
  int iVar9;
  size_t sVar10;
  Curl_handler *pCVar11;
  size_t authlen;
  char *pcVar12;
  byte *pbVar13;
  ulong uVar14;
  void *pvVar15;
  byte bVar16;
  long lVar17;
  size_t buflen;
  char cVar18;
  CURLUcode CVar19;
  Curl_URL *pCVar20;
  byte *unaff_R13;
  char *__s;
  byte *pbVar21;
  uint uVar22;
  byte bVar23;
  size_t urllen;
  CURLU tmpurl;
  dynbuf enc;
  dynbuf host;
  char schemebuf [41];
  byte *local_120;
  byte *local_118;
  ulong local_110;
  Curl_URL local_108;
  dynbuf local_a8;
  dynbuf local_88;
  int local_68;
  char local_64;
  
  bVar23 = 0;
  local_108.query = (char *)0x0;
  local_108.fragment = (char *)0x0;
  local_108.port = (char *)0x0;
  local_108.path = (char *)0x0;
  local_108.host = (char *)0x0;
  local_108.zoneid = (char *)0x0;
  local_108.password = (char *)0x0;
  local_108.options = (char *)0x0;
  local_108.scheme = (char *)0x0;
  local_108.user = (char *)0x0;
  local_108._80_8_ = 0;
  Curl_dyn_init(&local_88,8000000);
  CVar5 = Curl_junkscan(url,&local_110,(_Bool)((byte)(flags >> 0xb) & 1));
  if (CVar5 != CURLUE_OK) goto LAB_00168d9c;
  pcVar12 = (char *)&local_68;
  sVar10 = Curl_is_absolute_url(url,pcVar12,buflen,(flags & 0x204) != 0);
  cVar18 = (char)flags;
  if (sVar10 == 0) {
    if ((flags & 0x204) == 0) {
      CVar5 = CURLUE_BAD_SCHEME;
LAB_00169074:
      bVar3 = true;
    }
    else {
      CVar5 = CURLUE_OK;
      pcVar12 = (char *)0x0;
      __s = url;
      if ((flags & 4) != 0) {
        pcVar12 = "https";
      }
LAB_00168ebf:
      if (((int *)pcVar12 != (int *)0x0) &&
         (local_108.scheme = (*Curl_cstrdup)(pcVar12), local_108.scheme == (char *)0x0)) {
        CVar5 = CURLUE_OUT_OF_MEMORY;
        goto LAB_00169074;
      }
      authlen = strcspn(__s,"/?#");
      local_120 = (byte *)(__s + authlen);
      local_118 = (byte *)(url + (local_110 - (long)local_120));
      if (authlen == 0) {
        bVar3 = true;
        if ((flags >> 10 & 1) == 0) {
          CVar5 = CURLUE_NO_HOST;
        }
        else {
          CVar8 = Curl_dyn_add(&local_88,"");
          if (CVar8 == CURLE_OK) goto LAB_00169594;
          CVar5 = CURLUE_OUT_OF_MEMORY;
        }
      }
      else {
        CVar5 = parse_authority(&local_108,__s,authlen,flags,&local_88,sVar10 != 0);
        if (CVar5 != CURLUE_OK) goto LAB_00169074;
        CVar5 = CURLUE_OK;
        if ((flags >> 9 & 1) != 0 && (int *)pcVar12 == (int *)0x0) {
          pcVar12 = Curl_dyn_ptr(&local_88);
          iVar9 = curl_strnequal(pcVar12,"ftp.",4);
          if (iVar9 == 0) {
            iVar9 = curl_strnequal(pcVar12,"dict.",5);
            if (iVar9 == 0) {
              iVar9 = curl_strnequal(pcVar12,"ldap.",5);
              if (iVar9 == 0) {
                iVar9 = curl_strnequal(pcVar12,"imap.",5);
                if (iVar9 == 0) {
                  iVar9 = curl_strnequal(pcVar12,"smtp.",5);
                  if (iVar9 == 0) {
                    iVar9 = curl_strnequal(pcVar12,"pop3.",5);
                    pcVar12 = "pop3";
                    if (iVar9 == 0) {
                      pcVar12 = "http";
                    }
                  }
                  else {
                    pcVar12 = "smtp";
                  }
                }
                else {
                  pcVar12 = "imap";
                }
              }
              else {
                pcVar12 = "ldap";
              }
            }
            else {
              pcVar12 = "dict";
            }
          }
          else {
            pcVar12 = "ftp";
          }
          local_108.scheme = (*Curl_cstrdup)(pcVar12);
          if (local_108.scheme == (char *)0x0) {
            bVar3 = true;
            CVar5 = CURLUE_OUT_OF_MEMORY;
            goto LAB_00169078;
          }
          local_108._80_8_ = local_108._80_8_ | 0x40000;
          CVar5 = CURLUE_OK;
        }
LAB_00169594:
        bVar3 = false;
      }
    }
LAB_00169078:
    if (bVar3) goto LAB_00168d9c;
    if (bVar3) goto LAB_00168db3;
  }
  else {
    if (local_64 != '\0' || local_68 != 0x656c6966) {
      __s = url + sVar10;
      uVar6 = 0xfffffffe;
      do {
        pcVar1 = __s + 1;
        __s = __s + 1;
        uVar22 = uVar6 + 1;
        if (*pcVar1 != '/') break;
        uVar7 = uVar6 + 2;
        uVar6 = uVar22;
      } while (uVar7 < 4);
      pCVar11 = Curl_get_scheme_handler(pcVar12);
      bVar16 = (byte)((flags & 8) >> 3) | pCVar11 != (Curl_handler *)0x0;
      CVar19 = CURLUE_BAD_SLASHES;
      if (uVar22 < 3) {
        CVar19 = CURLUE_OK;
      }
      CVar5 = CURLUE_UNSUPPORTED_SCHEME;
      if (bVar16 != 0) {
        CVar5 = CVar19;
      }
      if ((uVar22 < 3 & bVar16) != 0) goto LAB_00168ebf;
      goto LAB_00169074;
    }
    if (local_110 < 7) {
      CVar5 = CURLUE_BAD_FILE_URL;
      bVar4 = true;
    }
    else {
      unaff_R13 = (byte *)(url + 5);
      local_118 = (byte *)(local_110 - 5);
      local_108.scheme = (*Curl_cstrdup)("file");
      if (local_108.scheme == (char *)0x0) {
        CVar5 = CURLUE_OUT_OF_MEMORY;
      }
      else {
        CVar5 = CURLUE_OK;
        if ((*unaff_R13 == 0x2f) && (url[6] == '/')) {
          pbVar13 = (byte *)(url + 7);
          if ((url[7] == 0x2f) ||
             ((((byte)((url[7] & 0xdfU) + 0xbf) < 0x1a && ((url[8] == '|' || (url[8] == ':')))) &&
              ((cVar2 = url[9], cVar2 == '\0' || ((cVar2 == '/' || (cVar2 == '\\')))))))) {
LAB_00169046:
            unaff_R13 = pbVar13;
            local_118 = (byte *)(url + (local_110 - (long)unaff_R13));
            bVar3 = true;
            CVar5 = CURLUE_OK;
            bVar4 = false;
          }
          else {
            iVar9 = curl_strnequal((char *)pbVar13,"localhost/",10);
            if ((iVar9 != 0) ||
               (iVar9 = curl_strnequal((char *)pbVar13,"127.0.0.1/",10), iVar9 != 0)) {
              pbVar13 = (byte *)(url + 0x10);
              goto LAB_00169046;
            }
            bVar4 = true;
            CVar5 = CURLUE_BAD_FILE_URL;
            bVar3 = false;
          }
          if (!bVar3) goto LAB_00169195;
        }
        Curl_dyn_reset(&local_88);
        if (((((*unaff_R13 != 0x2f) || (0x19 < (byte)((unaff_R13[1] & 0xdf) + 0xbf))) ||
             ((unaff_R13[2] != 0x7c && (unaff_R13[2] != 0x3a)))) ||
            (((bVar16 = unaff_R13[3], bVar16 != 0 && (bVar16 != 0x2f)) && (bVar16 != 0x5c)))) &&
           (((0x19 < (byte)((*unaff_R13 & 0xdf) + 0xbf) ||
             ((unaff_R13[1] != 0x7c && (unaff_R13[1] != 0x3a)))) ||
            ((bVar16 = unaff_R13[2], bVar16 != 0 && ((bVar16 != 0x2f && (bVar16 != 0x5c)))))))) {
          bVar4 = false;
          goto LAB_00169195;
        }
        CVar5 = CURLUE_BAD_FILE_URL;
      }
      bVar4 = true;
    }
LAB_00169195:
    local_120 = unaff_R13;
    if (bVar4) {
      if (!bVar4) goto LAB_00168db3;
      goto LAB_00168d9c;
    }
  }
  pbVar13 = (byte *)strchr((char *)local_120,0x23);
  if (pbVar13 == (byte *)0x0) {
LAB_00169211:
    pvVar15 = memchr(local_120,0x3f,(size_t)local_118);
    if (pvVar15 != (void *)0x0) {
      pbVar21 = local_120 + (long)local_118;
      if (pbVar13 != (byte *)0x0) {
        pbVar21 = pbVar13;
      }
      uVar14 = (long)pbVar21 - (long)pvVar15;
      local_108._80_8_ = local_108._80_8_ | 0x10000;
      if (uVar14 < 2) {
        local_108.query = (*Curl_cstrdup)("");
LAB_00169275:
        if (local_108.query == (char *)0x0) {
          bVar3 = true;
          CVar5 = CURLUE_OUT_OF_MEMORY;
        }
        else {
LAB_00169283:
          bVar3 = false;
        }
      }
      else {
        if (-1 < cVar18) {
          local_108.query = (char *)Curl_memdup0((char *)((long)pvVar15 + 1),uVar14 - 1);
          goto LAB_00169275;
        }
        Curl_dyn_init(&local_a8,8000000);
        CVar5 = urlencode_str(&local_a8,(char *)((long)pvVar15 + 1),uVar14 - 1,true,true);
        if (CVar5 == CURLUE_OK) {
          local_108.query = Curl_dyn_ptr(&local_a8);
        }
        bVar3 = CVar5 != CURLUE_OK;
        if (CVar5 == CURLUE_OK) goto LAB_00169283;
      }
      if (bVar3) goto LAB_00168d9c;
      if (bVar3) goto LAB_00168db3;
      local_118 = local_118 + -uVar14;
    }
    if (local_118 == (byte *)0x0) {
      local_118 = (byte *)0x0;
    }
    else if (cVar18 < '\0') {
      Curl_dyn_init(&local_a8,8000000);
      CVar5 = urlencode_str(&local_a8,(char *)local_120,(size_t)local_118,true,false);
      if (CVar5 != CURLUE_OK) goto LAB_00168d9c;
      local_118 = (byte *)Curl_dyn_len(&local_a8);
      local_120 = (byte *)Curl_dyn_ptr(&local_a8);
      local_108.path = (char *)local_120;
    }
    if ((byte *)0x1 < local_118) {
      if ((byte *)local_108.path == (byte *)0x0) {
        local_120 = (byte *)Curl_memdup0((char *)local_120,(size_t)local_118);
        local_108.path = (char *)local_120;
        if (local_120 == (byte *)0x0) {
          CVar5 = CURLUE_OUT_OF_MEMORY;
          goto LAB_00168d9c;
        }
      }
      else if (cVar18 < '\0') {
        local_108.path[(long)local_118] = 0;
      }
      if ((flags & 0x10) == 0) {
        iVar9 = dedotdotify((char *)local_120,(size_t)local_118,&local_a8.bufr);
        CVar19 = CURLUE_OUT_OF_MEMORY;
        if ((iVar9 == 0) && (CVar19 = CVar5, (byte *)local_a8.bufr != (byte *)0x0)) {
          (*Curl_cfree)(local_108.path);
          local_108.path = local_a8.bufr;
        }
        CVar5 = CVar19;
        if (iVar9 != 0) goto LAB_00168d9c;
      }
    }
    local_108.host = Curl_dyn_ptr(&local_88);
  }
  else {
    pbVar21 = pbVar13 + -(long)local_120;
    uVar14 = (long)local_118 - (long)pbVar21;
    local_108._80_8_ = local_108._80_8_ | 0x20000;
    local_118 = pbVar21;
    if (uVar14 < 2) goto LAB_00169211;
    if (cVar18 < '\0') {
      Curl_dyn_init(&local_a8,8000000);
      CVar5 = urlencode_str(&local_a8,(char *)(pbVar13 + 1),uVar14 - 1,true,false);
      if (CVar5 == CURLUE_OK) {
        local_108.fragment = Curl_dyn_ptr(&local_a8);
        goto LAB_00169211;
      }
    }
    else {
      local_108.fragment = (char *)Curl_memdup0((char *)(pbVar13 + 1),uVar14 - 1);
      if (local_108.fragment != (char *)0x0) goto LAB_00169211;
      CVar5 = CURLUE_OUT_OF_MEMORY;
    }
LAB_00168d9c:
    Curl_dyn_free(&local_88);
    free_urlhandle(&local_108);
  }
LAB_00168db3:
  if (CVar5 == CURLUE_OK) {
    free_urlhandle(u);
    pCVar20 = &local_108;
    for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
      u->scheme = pCVar20->scheme;
      pCVar20 = (Curl_URL *)((long)pCVar20 + ((ulong)bVar23 * -2 + 1) * 8);
      u = (CURLU *)((long)u + (ulong)bVar23 * -0x10 + 8);
    }
  }
  return CVar5;
}

Assistant:

static CURLUcode parseurl_and_replace(const char *url, CURLU *u,
                                      unsigned int flags)
{
  CURLUcode result;
  CURLU tmpurl;
  memset(&tmpurl, 0, sizeof(tmpurl));
  result = parseurl(url, &tmpurl, flags);
  if(!result) {
    free_urlhandle(u);
    *u = tmpurl;
  }
  return result;
}